

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::GetTrim3dStart(ON_Brep *this,int trim_index,ON_3dPoint *P)

{
  ON_BrepTrim *pOVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ON_BrepLoop *pOVar5;
  double *pdVar6;
  ON_BrepFace *this_00;
  bool local_81;
  ON_Interval local_60;
  int local_4c;
  ON_BrepTrim *pOStack_48;
  int fi;
  ON_BrepTrim *trim;
  ON_3dPoint uv;
  ON_Surface *srf;
  ON_3dPoint *P_local;
  int trim_index_local;
  ON_Brep *this_local;
  
  uv.z = 0.0;
  trim = (ON_BrepTrim *)ON_3dPoint::NanPoint.x;
  uv.x = ON_3dPoint::NanPoint.y;
  uv.y = ON_3dPoint::NanPoint.z;
  if ((((-1 < trim_index) &&
       (iVar2 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
       trim_index < iVar2)) &&
      (pOStack_48 = ON_ClassArray<ON_BrepTrim>::operator[]
                              ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,trim_index),
      -1 < pOStack_48->m_li)) &&
     (iVar2 = pOStack_48->m_li,
     iVar3 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L),
     iVar2 < iVar3)) {
    pOVar5 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,pOStack_48->m_li);
    iVar2 = pOVar5->m_fi;
    local_4c = iVar2;
    if ((-1 < iVar2) &&
       (iVar3 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F),
       pOVar1 = pOStack_48, iVar2 < iVar3)) {
      (*(pOStack_48->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[0x25])();
      pdVar6 = ON_Interval::operator[](&local_60,0);
      uVar4 = (*(pOVar1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                _vptr_ON_Object[0x3b])(*pdVar6,pOVar1,0,3,&trim,0,0);
      if ((uVar4 & 1) != 0) {
        this_00 = ON_ClassArray<ON_BrepFace>::operator[]
                            ((ON_ClassArray<ON_BrepFace> *)&this->m_F,local_4c);
        uv.z = (double)ON_BrepFace::SurfaceOf(this_00);
      }
    }
  }
  local_81 = false;
  if (uv.z != 0.0) {
    local_81 = ON_Surface::EvPoint((ON_Surface *)uv.z,(double)trim,uv.x,P,0,(int *)0x0);
  }
  return (bool)(-local_81 & 1);
}

Assistant:

bool
ON_Brep::GetTrim3dStart(int trim_index,
                        ON_3dPoint& P
                        ) const
{
  const ON_Surface* srf = nullptr;
  ON_3dPoint uv(ON_3dPoint::NanPoint);
  if ( trim_index >= 0 && trim_index < m_T.Count() )
  {
    const ON_BrepTrim& trim = m_T[trim_index];
    if ( trim.m_li >= 0 && trim.m_li < m_L.Count() )
    {
      const int fi = m_L[trim.m_li].m_fi;
      if ( fi >= 0 && fi < m_F.Count() )
      {
        if ( trim.Evaluate(trim.Domain()[0],0,3,&uv.x) )
        {
          srf = m_F[fi].SurfaceOf();
        }
      }
    }
  }
  return (nullptr != srf && srf->EvPoint(uv.x, uv.y, P) ? true : false);
}